

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O1

set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> * __thiscall
CFG::predecessors(CFG *this,CfgNode *node)

{
  _Base_ptr p_Var1;
  _Base_ptr *pp_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  
  if (node != (CfgNode *)0x0) {
    p_Var4 = &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = (this->m_nodes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var1 = &p_Var4->_M_header;
    for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[*(CfgNode **)(p_Var3 + 1) < node])
    {
      if (*(CfgNode **)(p_Var3 + 1) >= node) {
        p_Var1 = p_Var3;
      }
    }
    p_Var3 = &p_Var4->_M_header;
    if (((_Rb_tree_header *)p_Var1 != p_Var4) && (p_Var3 = p_Var1, node < *(CfgNode **)(p_Var1 + 1))
       ) {
      p_Var3 = &p_Var4->_M_header;
    }
    if ((_Rb_tree_header *)p_Var3 != p_Var4) {
      p_Var4 = &(this->m_preds)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (this->m_preds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var1 = &p_Var4->_M_header;
      for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[*(CfgNode **)(p_Var3 + 1) < node]
          ) {
        if (*(CfgNode **)(p_Var3 + 1) >= node) {
          p_Var1 = p_Var3;
        }
      }
      p_Var3 = &p_Var4->_M_header;
      if (((_Rb_tree_header *)p_Var1 != p_Var4) &&
         (p_Var3 = p_Var1, node < *(CfgNode **)(p_Var1 + 1))) {
        p_Var3 = &p_Var4->_M_header;
      }
      pp_Var2 = (_Base_ptr *)&emptyset;
      if ((_Rb_tree_header *)p_Var3 != p_Var4) {
        pp_Var2 = &p_Var3[1]._M_parent;
      }
      return (set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *)pp_Var2;
    }
  }
  __assert_fail("node != 0 && this->containsNode(node)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                ,0x88,"const std::set<CfgNode *> &CFG::predecessors(CfgNode *) const");
}

Assistant:

const std::set<CfgNode*>& CFG::predecessors(CfgNode* node) const {
	assert(node != 0 && this->containsNode(node));

	std::map<CfgNode*, std::set<CfgNode*>>::const_iterator it = m_preds.find(node);
	return (it != m_preds.end() ? it->second : emptyset);
}